

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::LogFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  long lVar2;
  BaseScalarFunction *function_00;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_439;
  code *local_438;
  undefined8 uStack_430;
  code *local_428;
  code *pcStack_420;
  code *local_418;
  undefined8 uStack_410;
  code *local_408;
  code *pcStack_400;
  LogicalType local_3f0 [24];
  LogicalType local_3d8 [24];
  LogicalType local_3c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a8;
  LogicalType local_390 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_378;
  LogicalType local_360 [24];
  LogicalType local_348 [24];
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_3f0,DOUBLE);
  __l._M_len = 1;
  __l._M_array = local_3f0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_378,__l,&local_439);
  duckdb::LogicalType::LogicalType(local_390,DOUBLE);
  uStack_410 = 0;
  local_418 = ScalarFunction::UnaryFunction<double,double,duckdb::Log10Operator>;
  pcStack_400 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_408 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_348,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_208,&local_378,local_390,&local_418,0,0,0,0,local_348,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_208);
  local_208._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_208 + 0xb0U),(_Any_data *)((long)&local_208 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_348);
  if (local_408 != (code *)0x0) {
    (*local_408)(&local_418,&local_418,3);
  }
  duckdb::LogicalType::~LogicalType(local_390);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_378);
  duckdb::LogicalType::~LogicalType(local_3f0);
  duckdb::LogicalType::LogicalType(local_3f0,DOUBLE);
  duckdb::LogicalType::LogicalType(local_3d8,DOUBLE);
  __l_00._M_len = 2;
  __l_00._M_array = local_3f0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a8,__l_00,&local_439);
  duckdb::LogicalType::LogicalType(local_3c0,DOUBLE);
  uStack_430 = 0;
  local_438 = ScalarFunction::BinaryFunction<double,double,double,duckdb::LogBaseOperator>;
  pcStack_420 = std::
                _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                ::_M_invoke;
  local_428 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_360,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_330,&local_3a8,local_3c0,&local_438,0,0,0,0,local_360,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_330);
  local_330._0_8_ = &PTR__ScalarFunction_008984e0;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_330 + 0xb0U),(_Any_data *)((long)&local_330 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_360);
  if (local_428 != (code *)0x0) {
    (*local_428)(&local_438,&local_438,3);
  }
  duckdb::LogicalType::~LogicalType(local_3c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a8);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_3f0 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function_00 = *(BaseScalarFunction **)(in_RDI + 0x20);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  if (function_00 != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function_00);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function_00 = function_00 + 0x128;
    } while (function_00 != pBVar1);
  }
  return;
}

Assistant:

ScalarFunctionSet LogFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                                 ScalarFunction::UnaryFunction<double, double, Log10Operator>));
	funcs.AddFunction(ScalarFunction({LogicalType::DOUBLE, LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                                 ScalarFunction::BinaryFunction<double, double, double, LogBaseOperator>));
	for (auto &function : funcs.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return funcs;
}